

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

void __thiscall Assimp::HMPImporter::CreateOutputFaceList(HMPImporter *this,uint width,uint height)

{
  aiMesh *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  aiVector3D *paVar10;
  aiVector3D *paVar11;
  void *pvVar12;
  aiFace *paVar13;
  aiVector3D *paVar14;
  ulong uVar15;
  aiVector3D *local_130;
  aiVector3t<float> *local_118;
  aiVector3t<float> *local_e8;
  aiVector3t<float> *local_c0;
  aiFace *local_98;
  uint local_80;
  uint local_7c;
  uint i;
  uint x;
  uint y;
  uint iCurrent;
  aiVector3D *pcUVOut;
  aiVector3D *pcUVs;
  aiVector3D *pcNorOut;
  aiVector3D *pcVertOut;
  aiFace *pcFaceOut;
  aiVector3D *pcNormals;
  aiVector3D *pcVertices;
  aiMesh *pcMesh;
  uint height_local;
  uint width_local;
  HMPImporter *this_local;
  
  paVar1 = *((this->super_MDLImporter).pScene)->mMeshes;
  paVar1->mNumFaces = (width - 1) * (height - 1);
  uVar7 = CONCAT44(0,paVar1->mNumFaces);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar8 = SUB168(auVar2 * ZEXT816(0x10),0);
  uVar15 = uVar8 + 8;
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar8) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar15);
  *puVar9 = uVar7;
  paVar13 = (aiFace *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_98 = paVar13;
    do {
      aiFace::aiFace(local_98);
      local_98 = local_98 + 1;
    } while (local_98 != paVar13 + uVar7);
  }
  paVar1->mFaces = paVar13;
  paVar1->mNumVertices = paVar1->mNumFaces << 2;
  uVar7 = CONCAT44(0,paVar1->mNumVertices);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  uVar8 = SUB168(auVar3 * ZEXT816(0xc),0);
  if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  paVar10 = (aiVector3D *)operator_new__(uVar8);
  if (uVar7 != 0) {
    local_c0 = paVar10;
    do {
      aiVector3t<float>::aiVector3t(local_c0);
      local_c0 = local_c0 + 1;
    } while (local_c0 != paVar10 + uVar7);
  }
  uVar7 = CONCAT44(0,paVar1->mNumVertices);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar8 = SUB168(auVar4 * ZEXT816(0xc),0);
  if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  paVar11 = (aiVector3D *)operator_new__(uVar8);
  if (uVar7 != 0) {
    local_e8 = paVar11;
    do {
      aiVector3t<float>::aiVector3t(local_e8);
      local_e8 = local_e8 + 1;
    } while (local_e8 != paVar11 + uVar7);
  }
  pcVertOut = (aiVector3D *)paVar1->mFaces;
  if (paVar1->mTextureCoords[0] == (aiVector3D *)0x0) {
    local_130 = (aiVector3D *)0x0;
  }
  else {
    uVar7 = CONCAT44(0,paVar1->mNumVertices);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar7;
    uVar8 = SUB168(auVar5 * ZEXT816(0xc),0);
    if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    local_130 = (aiVector3D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_118 = local_130;
      do {
        aiVector3t<float>::aiVector3t(local_118);
        local_118 = local_118 + 1;
      } while (local_118 != local_130 + uVar7);
    }
  }
  _y = local_130;
  x = 0;
  pcUVs = paVar11;
  pcNorOut = paVar10;
  for (i = 0; i < height - 1; i = i + 1) {
    for (local_7c = 0; local_7c < width - 1; local_7c = local_7c + 1) {
      pcVertOut->x = 5.60519e-45;
      pvVar12 = operator_new__(0x10);
      *(void **)&pcVertOut->z = pvVar12;
      paVar14 = paVar1->mVertices + (i * width + local_7c);
      fVar6 = paVar14->y;
      pcNorOut->x = paVar14->x;
      pcNorOut->y = fVar6;
      pcNorOut->z = paVar14->z;
      paVar14 = paVar1->mVertices + ((i + 1) * width + local_7c);
      fVar6 = paVar14->y;
      pcNorOut[1].x = paVar14->x;
      pcNorOut[1].y = fVar6;
      pcNorOut[1].z = paVar14->z;
      paVar14 = paVar1->mVertices + ((i + 1) * width + local_7c + 1);
      fVar6 = paVar14->y;
      pcNorOut[2].x = paVar14->x;
      pcNorOut[2].y = fVar6;
      pcNorOut[2].z = paVar14->z;
      paVar14 = paVar1->mVertices + (i * width + local_7c + 1);
      fVar6 = paVar14->y;
      pcNorOut[3].x = paVar14->x;
      pcNorOut[3].y = fVar6;
      pcNorOut[3].z = paVar14->z;
      paVar14 = paVar1->mNormals + (i * width + local_7c);
      fVar6 = paVar14->y;
      pcUVs->x = paVar14->x;
      pcUVs->y = fVar6;
      pcUVs->z = paVar14->z;
      paVar14 = paVar1->mNormals + ((i + 1) * width + local_7c);
      fVar6 = paVar14->y;
      pcUVs[1].x = paVar14->x;
      pcUVs[1].y = fVar6;
      pcUVs[1].z = paVar14->z;
      paVar14 = paVar1->mNormals + ((i + 1) * width + local_7c + 1);
      fVar6 = paVar14->y;
      pcUVs[2].x = paVar14->x;
      pcUVs[2].y = fVar6;
      pcUVs[2].z = paVar14->z;
      paVar14 = paVar1->mNormals + (i * width + local_7c + 1);
      fVar6 = paVar14->y;
      pcUVs[3].x = paVar14->x;
      pcUVs[3].y = fVar6;
      pcUVs[3].z = paVar14->z;
      if (paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
        paVar14 = paVar1->mTextureCoords[0] + (i * width + local_7c);
        fVar6 = paVar14->y;
        _y->x = paVar14->x;
        _y->y = fVar6;
        _y->z = paVar14->z;
        paVar14 = paVar1->mTextureCoords[0] + ((i + 1) * width + local_7c);
        fVar6 = paVar14->y;
        _y[1].x = paVar14->x;
        _y[1].y = fVar6;
        _y[1].z = paVar14->z;
        paVar14 = paVar1->mTextureCoords[0] + ((i + 1) * width + local_7c + 1);
        fVar6 = paVar14->y;
        _y[2].x = paVar14->x;
        _y[2].y = fVar6;
        _y[2].z = paVar14->z;
        paVar14 = paVar1->mTextureCoords[0] + (i * width + local_7c + 1);
        fVar6 = paVar14->y;
        _y[3].x = paVar14->x;
        _y[3].y = fVar6;
        _y[3].z = paVar14->z;
        _y = _y + 4;
      }
      for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
        *(uint *)(*(long *)&pcVertOut->z + (ulong)local_80 * 4) = x;
        x = x + 1;
      }
      pcVertOut = (aiVector3D *)&pcVertOut[1].y;
      pcUVs = pcUVs + 4;
      pcNorOut = pcNorOut + 4;
    }
  }
  if (paVar1->mVertices != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mVertices);
  }
  paVar1->mVertices = paVar10;
  if (paVar1->mNormals != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mNormals);
  }
  paVar1->mNormals = paVar11;
  if (paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
    if (paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
      operator_delete__(paVar1->mTextureCoords[0]);
    }
    paVar1->mTextureCoords[0] = local_130;
  }
  return;
}

Assistant:

void HMPImporter::CreateOutputFaceList(unsigned int width,unsigned int height)
{
    aiMesh* const pcMesh = this->pScene->mMeshes[0];

    // Allocate enough storage
    pcMesh->mNumFaces = (width-1) * (height-1);
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

    pcMesh->mNumVertices   = pcMesh->mNumFaces*4;
    aiVector3D* pcVertices = new aiVector3D[pcMesh->mNumVertices];
    aiVector3D* pcNormals  = new aiVector3D[pcMesh->mNumVertices];

    aiFace* pcFaceOut(pcMesh->mFaces);
    aiVector3D* pcVertOut = pcVertices;
    aiVector3D* pcNorOut = pcNormals;

    aiVector3D* pcUVs = pcMesh->mTextureCoords[0] ? new aiVector3D[pcMesh->mNumVertices] : NULL;
    aiVector3D* pcUVOut(pcUVs);

    // Build the terrain square
    unsigned int iCurrent = 0;
    for (unsigned int y = 0; y < height-1;++y)  {
        for (unsigned int x = 0; x < width-1;++x,++pcFaceOut)   {
            pcFaceOut->mNumIndices = 4;
            pcFaceOut->mIndices = new unsigned int[4];

            *pcVertOut++ = pcMesh->mVertices[y*width+x];
            *pcVertOut++ = pcMesh->mVertices[(y+1)*width+x];
            *pcVertOut++ = pcMesh->mVertices[(y+1)*width+x+1];
            *pcVertOut++ = pcMesh->mVertices[y*width+x+1];


            *pcNorOut++ = pcMesh->mNormals[y*width+x];
            *pcNorOut++ = pcMesh->mNormals[(y+1)*width+x];
            *pcNorOut++ = pcMesh->mNormals[(y+1)*width+x+1];
            *pcNorOut++ = pcMesh->mNormals[y*width+x+1];

            if (pcMesh->mTextureCoords[0])
            {
                *pcUVOut++ = pcMesh->mTextureCoords[0][y*width+x];
                *pcUVOut++ = pcMesh->mTextureCoords[0][(y+1)*width+x];
                *pcUVOut++ = pcMesh->mTextureCoords[0][(y+1)*width+x+1];
                *pcUVOut++ = pcMesh->mTextureCoords[0][y*width+x+1];
            }

            for (unsigned int i = 0; i < 4;++i)
                pcFaceOut->mIndices[i] = iCurrent++;
        }
    }
    delete[] pcMesh->mVertices;
    pcMesh->mVertices = pcVertices;

    delete[] pcMesh->mNormals;
    pcMesh->mNormals = pcNormals;

    if (pcMesh->mTextureCoords[0])
    {
        delete[] pcMesh->mTextureCoords[0];
        pcMesh->mTextureCoords[0] = pcUVs;
    }
}